

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slgh_compile.cc
# Opt level: O2

OperandSymbol * __thiscall
ConsistencyChecker::getOperandSymbol(ConsistencyChecker *this,int4 slot,OpTpl *op,Constructor *ct)

{
  if (slot != -1) {
    op = (OpTpl *)((op->input).super__Vector_base<VarnodeTpl_*,_std::allocator<VarnodeTpl_*>_>.
                   _M_impl.super__Vector_impl_data._M_start + slot);
  }
  if (*(int *)(op->output + 0x40) == 1) {
    return *(OperandSymbol **)(*(long *)(ct + 0x18) + (long)*(int *)(op->output + 0x48) * 8);
  }
  return (OperandSymbol *)0x0;
}

Assistant:

OperandSymbol *ConsistencyChecker::getOperandSymbol(int4 slot,OpTpl *op,Constructor *ct)

{
  VarnodeTpl *vn;
  OperandSymbol *opsym;
  int4 handindex;

  if (slot == -1)
    vn = op->getOut();
  else
    vn = op->getIn(slot);
  
  switch(vn->getSize().getType()) {
  case ConstTpl::handle:
    handindex = vn->getSize().getHandleIndex();
    opsym = ct->getOperand(handindex);
    break;
  default:
    opsym = (OperandSymbol *)0;
    break;
  }
  return opsym;
}